

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked-list.cpp
# Opt level: O2

void __thiscall LinkedList::deletion(LinkedList *this,Node **head,int number)

{
  Node *pNVar1;
  ostream *poVar2;
  Node *pNVar3;
  
  pNVar1 = *head;
  if (pNVar1 == (Node *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Empty Linked List");
    std::endl<char,std::char_traits<char>>(poVar2);
    return;
  }
  if (pNVar1->next == (Node *)0x0) {
    freeUpMemory(this,head);
    return;
  }
  if (pNVar1->data != number) {
    while (pNVar3 = pNVar1, pNVar1 = pNVar3->next, pNVar1 != (Node *)0x0) {
      if (pNVar1->data == number) {
        pNVar3->next = pNVar1->next;
        operator_delete(pNVar1,0x10);
        pNVar1 = pNVar3;
      }
    }
    return;
  }
  *head = pNVar1->next;
  operator_delete(pNVar1,0x10);
  return;
}

Assistant:

void LinkedList::deletion(Node** head, int number) {
	Node* last = *head;
	Node* next = nullptr;

	// Check if any node exists in linked list
	if (last == NULL) {
		std::cout << "Empty Linked List" << std::endl;
		return;
	}

	// Check if only one node is in linked list
	if (last->next == nullptr) {
		freeUpMemory(head);
		return;
	}

	// Check if node to delete is first node
	if (last->data == number) {
		*head = last->next;
		freeUpMemory(&last);
		return;
	}

	// Loop through and find node to delete
	while (last->next != nullptr) {
		next = last->next;
		if (next->data == number) {
			if (next->next == nullptr) {
				last->next = nullptr;
			} else {
				last->next = next->next;
			}
			freeUpMemory(&next);
		}
		else {
			last = last->next;
			continue;
		}
	}
}